

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O0

iterator __thiscall
first_fit_heap<16UL>::free_list_container::try_merge_back(free_list_container *this,iterator it)

{
  bool bVar1;
  header_free *phVar2;
  header_free *phVar3;
  header_free *phVar4;
  size_t sVar5;
  size_t sVar6;
  header_free *following_free;
  header_used *following;
  free_list_container *this_local;
  iterator it_local;
  
  this_local = (free_list_container *)it.block;
  phVar2 = iterator::operator*((iterator *)&this_local);
  phVar2 = (header_free *)header_used::following_block(&phVar2->super_header_used,this->mem);
  if ((phVar2 != (header_free *)0x0) && (bVar1 = header_used::is_free((header_used *)phVar2), bVar1)
     ) {
    phVar3 = iterator::operator*((iterator *)&this_local);
    phVar4 = header_free::next(phVar2);
    header_free::next(phVar3,phVar4);
    phVar3 = iterator::operator*((iterator *)&this_local);
    phVar4 = iterator::operator*((iterator *)&this_local);
    sVar5 = header_used::size(&phVar4->super_header_used);
    sVar6 = header_used::size((header_used *)phVar2);
    header_used::size(&phVar3->super_header_used,sVar5 + sVar6 + 0x10);
    phVar2 = iterator::operator*((iterator *)&this_local);
    header_free::update_footer(phVar2);
  }
  return (iterator)(header_free *)this_local;
}

Assistant:

iterator try_merge_back(iterator it)
        {
            auto *following = (*it)->following_block(mem);

            if (following and following->is_free()) {
                auto *following_free = static_cast<header_free*>(following);
                (*it)->next(following_free->next());
                (*it)->size((*it)->size() + following_free->size() + sizeof(header_used));
                (*it)->update_footer();
            }

            return it;
        }